

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_serialize.c
# Opt level: O0

void lj_serialize_decode(lua_State *L,TValue *o,GCstr *str)

{
  char *pcVar1;
  char *r;
  SBufExt sbx;
  GCstr *str_local;
  TValue *o_local;
  lua_State *L_local;
  
  sbx._64_8_ = str;
  memset(&r,0,0x48);
  sbx.e = (char *)(sbx._64_8_ + 0x18);
  sbx.b = (char *)((long)&(L->nextgc).gcptr64 + 3);
  r = sbx.e + *(uint *)(sbx._64_8_ + 0x14);
  sbx.dict_mt.gcptr64._0_4_ = 100;
  sbx.w = r;
  pcVar1 = serialize_get(sbx.e,(SBufExt *)&r,o);
  if (pcVar1 != r) {
    lj_err_caller(L,LJ_ERR_BUFFER_LEFTOV);
  }
  return;
}

Assistant:

void lj_serialize_decode(lua_State *L, TValue *o, GCstr *str)
{
  SBufExt sbx;
  char *r;
  memset(&sbx, 0, sizeof(SBufExt));
  lj_bufx_set_cow(L, &sbx, strdata(str), str->len);
  /* No need to set sbx.cowref here. */
  sbx.depth = LJ_SERIALIZE_DEPTH;
  r = serialize_get(sbx.r, &sbx, o);
  if (r != sbx.w) lj_err_caller(L, LJ_ERR_BUFFER_LEFTOV);
}